

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall capnp::_::ReaderArena::ReaderArena(ReaderArena *this,MessageReader *message)

{
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  ArrayPtr<const_capnp::word> firstSegment;
  
  iVar1 = (*message->_vptr_MessageReader[2])(message,0);
  firstSegment.ptr._4_4_ = extraout_var;
  firstSegment.ptr._0_4_ = iVar1;
  firstSegment.size_ = extraout_RDX;
  ReaderArena(this,message,firstSegment);
  return;
}

Assistant:

ReaderArena::ReaderArena(MessageReader* message)
    : ReaderArena(message, message->getSegment(0)) {}